

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdFreeHandle(void *handle)

{
  cfd::Initialize();
  cfd::capi::CfdCapiManager::FreeHandle((CfdCapiManager *)cfd::capi::capi_instance,handle);
  return 0;
}

Assistant:

int CfdFreeHandle(void* handle) {
  try {
    cfd::Initialize();
    cfd::capi::capi_instance.FreeHandle(handle);
    return kCfdSuccess;
  } catch (...) {
    return kCfdUnknownError;
  }
}